

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_17b1b6f::CheckPathParametersEx
          (anon_unknown_dwarf_17b1b6f *this,cmGeneratorExpressionContext *ctx,
          GeneratorExpressionContent *cnt,string_view option,size_t count,int required,bool exactly)

{
  byte bVar1;
  int iVar2;
  char local_e2 [2];
  char *local_e0;
  char *local_d8;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  iVar2 = (int)count;
  bVar1 = iVar2 < (int)option._M_str & (byte)required | (int)option._M_str < iVar2;
  if (bVar1 == 1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)ctx);
    local_60.View_._M_len = 7;
    local_60.View_._M_str = "$<PATH:";
    local_d8 = "at least";
    if ((byte)required != 0) {
      local_d8 = "exactly";
    }
    local_e2[1] = 0x20;
    local_e0 = "two parameters";
    if (iVar2 == 1) {
      local_e0 = "one parameter";
    }
    local_e2[0] = '.';
    local_90.View_._M_len = (size_t)cnt;
    local_90.View_._M_str = (char *)option._M_len;
    cmStrCat<char[23],char_const*,char,char_const*,char>
              (&local_d0,&local_60,&local_90,(char (*) [23])"> expression requires ",&local_d8,
               local_e2 + 1,&local_e0,local_e2);
    reportError((cmGeneratorExpressionContext *)this,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool CheckPathParametersEx(cmGeneratorExpressionContext* ctx,
                           const GeneratorExpressionContent* cnt,
                           cm::string_view option, std::size_t count,
                           int required = 1, bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<PATH:", option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ',
                         (required == 1 ? "one parameter" : "two parameters"),
                         '.'));
    return false;
  }
  return true;
}